

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O2

void __thiscall
testing::internal::MatcherBase<const_google::protobuf::FieldDescriptor_*const_&>::~MatcherBase
          (MatcherBase<const_google::protobuf::FieldDescriptor_*const_&> *this)

{
  (this->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_01607d30;
  Destroy(this);
  return;
}

Assistant:

~MatcherBase() override { Destroy(); }